

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_format(lua_State *L)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  byte *pbVar8;
  ulong uVar9;
  char *pcVar10;
  size_t l_00;
  byte *pbVar11;
  lua_Number lVar12;
  char form [18];
  size_t l;
  size_t sfl;
  luaL_Buffer b;
  char buff [512];
  int local_2294;
  undefined8 local_2290;
  char local_2288 [32];
  ulong local_2268;
  byte *local_2260;
  size_t local_2258;
  luaL_Buffer local_2250;
  byte local_238 [520];
  
  pbVar4 = (byte *)luaL_checklstring(L,1,&local_2258);
  local_2290 = L;
  luaL_buffinit(L,&local_2250);
  if (0 < (long)local_2258) {
    pbVar11 = pbVar4 + local_2258;
    local_2294 = 1;
    local_2260 = pbVar11;
    do {
      bVar2 = *pbVar4;
      if (bVar2 != 0x25) {
        if (local_238 <= local_2250.p) {
          luaL_prepbuffer(&local_2250);
          bVar2 = *pbVar4;
        }
        pbVar4 = pbVar4 + 1;
        *local_2250.p = bVar2;
        local_2250.p = (char *)((byte *)local_2250.p + 1);
        goto LAB_00113265;
      }
      pbVar11 = pbVar4 + 1;
      bVar2 = pbVar4[1];
      if (bVar2 == 0x25) {
        bVar2 = 0x25;
        if (local_238 <= local_2250.p) {
          luaL_prepbuffer(&local_2250);
          bVar2 = *pbVar11;
        }
        pbVar4 = pbVar4 + 2;
        *local_2250.p = bVar2;
        pbVar11 = local_2260;
        local_2250.p = (char *)((byte *)local_2250.p + 1);
        goto LAB_00113265;
      }
      pbVar4 = pbVar11;
      if (bVar2 == 0) {
        bVar2 = 0;
      }
      else {
        do {
          pvVar5 = memchr("-+ #0",(int)(char)bVar2,6);
          if (pvVar5 == (void *)0x0) goto LAB_00113095;
          bVar2 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        } while (bVar2 != 0);
        bVar2 = 0;
      }
LAB_00113095:
      if (5 < (ulong)((long)pbVar4 - (long)pbVar11)) {
        luaL_error(local_2290,"invalid format (repeated flags)");
        bVar2 = *pbVar4;
      }
      uVar9 = (ulong)(bVar2 - 0x30 < 10);
      pbVar4 = pbVar4 + (pbVar4[uVar9] - 0x30 < 10) + uVar9;
      bVar2 = *pbVar4;
      if (bVar2 == 0x2e) {
        pbVar8 = pbVar4 + 2;
        if (9 < pbVar4[1] - 0x30) {
          pbVar8 = pbVar4 + 1;
        }
        pbVar4 = pbVar8 + (pbVar4[(ulong)(pbVar4[1] - 0x30 < 10) + 1] - 0x30 < 10);
        bVar2 = *pbVar4;
      }
      if (bVar2 - 0x30 < 10) {
        luaL_error(local_2290,"invalid format (width or precision too long)");
      }
      local_2294 = local_2294 + 1;
      local_2288[0] = '%';
      strncpy(local_2288 + 1,(char *)pbVar11,(size_t)(pbVar4 + (1 - (long)pbVar11)));
      pbVar4[(long)(local_2288 + (2 - (long)pbVar11))] = 0;
      bVar2 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      if (bVar2 < 99) {
        if ((bVar2 != 0x45) && (bVar2 != 0x47)) {
          if (bVar2 != 0x58) goto switchD_00113180_caseD_68;
          goto switchD_00113180_caseD_6f;
        }
switchD_00113180_caseD_65:
        luaL_checknumber(local_2290,local_2294);
        sprintf((char *)local_238,local_2288);
        goto LAB_00113248;
      }
      switch(bVar2) {
      case 99:
        lVar12 = luaL_checknumber(local_2290,local_2294);
        sprintf((char *)local_238,local_2288,(ulong)(uint)(int)lVar12);
        goto LAB_00113248;
      case 100:
      case 0x69:
        sVar6 = strlen(local_2288);
        cVar1 = local_2288[sVar6 - 1];
        (local_2288 + (sVar6 - 1))[0] = 'l';
        (local_2288 + (sVar6 - 1))[1] = '\0';
        local_2288[sVar6] = cVar1;
        local_2288[sVar6 + 1] = '\0';
        lVar12 = luaL_checknumber(local_2290,local_2294);
        pcVar10 = (char *)(long)lVar12;
        goto LAB_00113222;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_00113180_caseD_65;
      default:
switchD_00113180_caseD_68:
        iVar3 = luaL_error(local_2290,"invalid option \'%%%c\' to \'format\'",
                           (ulong)(uint)(int)(char)bVar2);
        return iVar3;
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_00113180_caseD_6f:
        sVar6 = strlen(local_2288);
        cVar1 = local_2288[sVar6 - 1];
        (local_2288 + (sVar6 - 1))[0] = 'l';
        (local_2288 + (sVar6 - 1))[1] = '\0';
        local_2288[sVar6] = cVar1;
        local_2288[sVar6 + 1] = '\0';
        lVar12 = luaL_checknumber(local_2290,local_2294);
        pcVar10 = (char *)((long)(lVar12 - 9.223372036854776e+18) & (long)lVar12 >> 0x3f |
                          (long)lVar12);
LAB_00113222:
        sprintf((char *)local_238,local_2288,pcVar10);
LAB_00113248:
        sVar6 = strlen((char *)local_238);
        luaL_addlstring(&local_2250,(char *)local_238,sVar6);
        pbVar11 = local_2260;
        break;
      case 0x71:
        pbVar11 = (byte *)luaL_checklstring(local_2290,local_2294,&local_2268);
        if (local_238 <= local_2250.p) {
          luaL_prepbuffer(&local_2250);
        }
        *local_2250.p = 0x22;
        local_2250.p = (char *)((byte *)local_2250.p + 1);
        uVar9 = local_2268;
        while (local_2268 = uVar9 - 1, uVar9 != 0) {
          bVar2 = *pbVar11;
          if (bVar2 < 0xd) {
            if (bVar2 == 0) {
              l_00 = 4;
              pcVar10 = "\\000";
              goto LAB_001133f6;
            }
            if (bVar2 != 10) goto LAB_001133ae;
LAB_00113358:
            pbVar8 = (byte *)local_2250.p;
            if (local_238 <= local_2250.p) {
              luaL_prepbuffer(&local_2250);
              pbVar8 = (byte *)local_2250.p;
            }
            local_2250.p = (char *)(pbVar8 + 1);
            *pbVar8 = 0x5c;
            if (local_238 <= local_2250.p) {
              luaL_prepbuffer(&local_2250);
            }
            *local_2250.p = *pbVar11;
            local_2250.p = (char *)((byte *)local_2250.p + 1);
          }
          else if (bVar2 == 0xd) {
            l_00 = 2;
            pcVar10 = "\\r";
LAB_001133f6:
            luaL_addlstring(&local_2250,pcVar10,l_00);
          }
          else {
            if ((bVar2 == 0x5c) || (bVar2 == 0x22)) goto LAB_00113358;
LAB_001133ae:
            if (local_238 <= local_2250.p) {
              luaL_prepbuffer(&local_2250);
              bVar2 = *pbVar11;
            }
            *local_2250.p = bVar2;
            local_2250.p = (char *)((byte *)local_2250.p + 1);
          }
          pbVar11 = pbVar11 + 1;
          uVar9 = local_2268;
        }
        if (local_238 <= local_2250.p) {
          luaL_prepbuffer(&local_2250);
        }
        *local_2250.p = 0x22;
        pbVar11 = local_2260;
        local_2250.p = (char *)((byte *)local_2250.p + 1);
        break;
      case 0x73:
        pcVar10 = luaL_checklstring(local_2290,local_2294,&local_2268);
        pcVar7 = strchr(local_2288,0x2e);
        if ((pcVar7 != (char *)0x0) || (local_2268 < 100)) goto LAB_00113222;
        lua_pushvalue(local_2290,local_2294);
        luaL_addvalue(&local_2250);
        pbVar11 = local_2260;
      }
LAB_00113265:
    } while (pbVar4 < pbVar11);
  }
  luaL_pushresult(&local_2250);
  return 1;
}

Assistant:

static int str_format (lua_State *L) {
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format (`%...') */
      char buff[MAX_ITEM];  /* to store the formatted item */
      arg++;
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          sprintf(buff, form, (int)luaL_checknumber(L, arg));
          break;
        }
        case 'd':  case 'i': {
          addintlen(form);
          sprintf(buff, form, (LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'o':  case 'u':  case 'x':  case 'X': {
          addintlen(form);
          sprintf(buff, form, (unsigned LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'e':  case 'E': case 'f':
        case 'g': case 'G': {
          sprintf(buff, form, (double)luaL_checknumber(L, arg));
          break;
        }
        case 'q': {
          addquoted(L, &b, arg);
          continue;  /* skip the 'addsize' at the end */
        }
        case 's': {
          size_t l;
          const char *s = luaL_checklstring(L, arg, &l);
          if (!strchr(form, '.') && l >= 100) {
            /* no precision and string is too long to be formatted;
               keep original string */
            lua_pushvalue(L, arg);
            luaL_addvalue(&b);
            continue;  /* skip the `addsize' at the end */
          }
          else {
            sprintf(buff, form, s);
            break;
          }
        }
        default: {  /* also treat cases `pnLlh' */
          return luaL_error(L, "invalid option " LUA_QL("%%%c") " to "
                               LUA_QL("format"), *(strfrmt - 1));
        }
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}